

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-hexfloat.cc
# Opt level: O0

LiteralType AllFloatsRoundtripTest::ClassifyFloat(uint32_t float_bits)

{
  bool bVar1;
  undefined4 local_c;
  uint32_t float_bits_local;
  
  bVar1 = is_infinity_or_nan(float_bits);
  if (bVar1) {
    if ((float_bits & 0x7fffff) == 0) {
      local_c = Infinity;
    }
    else {
      local_c = Nan;
    }
  }
  else {
    local_c = Hexfloat;
  }
  return local_c;
}

Assistant:

static LiteralType ClassifyFloat(uint32_t float_bits) {
    if (is_infinity_or_nan(float_bits)) {
      if (float_bits & 0x7fffff) {
        return LiteralType::Nan;
      } else {
        return LiteralType::Infinity;
      }
    } else {
      return LiteralType::Hexfloat;
    }
  }